

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * __thiscall Catch::Runner::runTests(Totals *__return_storage_ptr__,Runner *this)

{
  size_type sVar1;
  size_t sVar2;
  int iVar3;
  undefined4 extraout_var;
  TestSpecParser *this_00;
  IRegistryHub *pIVar4;
  undefined4 extraout_var_00;
  iterator iVar5;
  _Alloc_hider __k;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> testCases;
  RunContext context;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_3b8;
  string local_398;
  undefined1 local_378 [32];
  size_type local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_350;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  TagAliasRegistry *local_310;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  pointer local_2c8;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_2b8;
  RunContext local_298;
  
  local_398._M_string_length = (size_type)local_398._M_dataplus._M_p;
  local_378._0_8_ = (this->m_config).m_p;
  if ((Config *)local_378._0_8_ != (Config *)0x0) {
    (*(((Config *)local_378._0_8_)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
      super_NonCopyable._vptr_NonCopyable[2])();
  }
  RunContext::RunContext(&local_298,(Ptr<const_Catch::IConfig> *)local_378,&this->m_reporter);
  if ((Config *)local_378._0_8_ != (Config *)0x0) {
    (**(code **)((long)*(IShared *)local_378._0_8_ + 0x18))();
  }
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->testCases).failedButOk = 0;
  *(undefined1 (*) [16])&(__return_storage_ptr__->assertions).failedButOk = (undefined1  [16])0x0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  local_378._0_8_ = (IConfig *)(local_378 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"");
  RunContext::testGroupStarting(&local_298,(string *)local_378,1,1);
  if ((IConfig *)local_378._0_8_ != (IConfig *)(local_378 + 0x10)) {
    operator_delete((void *)local_378._0_8_);
  }
  iVar3 = (*(((this->m_config).m_p)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
            super_NonCopyable._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_3b8,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar3));
  if (local_3b8.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_3b8.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    TagAliasRegistry::get();
    local_358 = 0;
    aStack_350._M_local_buf[0] = '\0';
    local_340 = (undefined1  [16])0x0;
    local_330 = (undefined1  [16])0x0;
    local_320 = (undefined1  [16])0x0;
    local_310 = &TagAliasRegistry::get::instance;
    local_398._M_dataplus._M_p = (pointer)((long)&local_398 + 0x10);
    local_378._24_8_ = &aStack_350;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"~[.]","");
    this_00 = TestSpecParser::parse((TestSpecParser *)local_378,&local_398);
    TestSpecParser::addFilter(this_00);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_2d8,&(this_00->m_testSpec).m_filters);
    local_2b8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_3b8.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2b8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_3b8.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_2b8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_3b8.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_3b8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_2c8;
    local_3b8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_2d8._0_8_;
    local_3b8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_2d8._8_8_;
    local_2d8 = (undefined1  [16])0x0;
    local_2c8 = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_2b8);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_2d8);
    if (local_398._M_dataplus._M_p != (pointer)((long)&local_398 + 0x10)) {
      operator_delete(local_398._M_dataplus._M_p);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               (local_330 + 8));
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
               *)local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._24_8_ != &aStack_350) {
      operator_delete((void *)local_378._24_8_);
    }
  }
  local_398._M_dataplus._M_p = (pointer)0x0;
  local_398._M_string_length = 0;
  local_398.field_2._M_allocated_capacity = 0;
  pIVar4 = getRegistryHub();
  iVar3 = (*pIVar4->_vptr_IRegistryHub[3])(pIVar4);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x18))
            ((long *)CONCAT44(extraout_var_00,iVar3),&local_3b8,(this->m_config).m_p,&local_398);
  sVar1 = local_398._M_string_length;
  if (local_398._M_dataplus._M_p != (pointer)local_398._M_string_length) {
    local_2e8 = (undefined1  [16])0x0;
    local_2f8 = (undefined1  [16])0x0;
    local_308 = (undefined1  [16])0x0;
    __k._M_p = local_398._M_dataplus._M_p;
    do {
      iVar5 = std::
              _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
              ::find(&(this->m_testsAlreadyRun)._M_t,(key_type *)__k._M_p);
      sVar2 = local_298.m_totals.assertions.failed;
      if ((_Rb_tree_header *)iVar5._M_node ==
          &(this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header) {
        iVar3 = (*((local_298.m_config.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])
                          ();
        if (sVar2 == (long)iVar3) break;
        RunContext::runTest((Totals *)local_378,&local_298,(TestCase *)__k._M_p);
        local_2e8._0_8_ = local_378._0_8_ + local_2e8._0_8_;
        local_2e8._8_8_ = local_2e8._8_8_ + local_378._8_8_;
        (__return_storage_ptr__->assertions).passed = local_2e8._0_8_;
        (__return_storage_ptr__->assertions).failed = local_2e8._8_8_;
        local_2f8._0_8_ = local_2f8._0_8_ + local_378._16_8_;
        local_2f8._8_8_ = local_2f8._8_8_ + local_378._24_8_;
        (__return_storage_ptr__->assertions).failedButOk = local_2f8._0_8_;
        (__return_storage_ptr__->testCases).passed = local_2f8._8_8_;
        local_308._0_8_ = local_308._0_8_ + local_358;
        local_308._8_8_ =
             local_308._8_8_ +
             CONCAT71(aStack_350._M_allocated_capacity._1_7_,aStack_350._M_local_buf[0]);
        (__return_storage_ptr__->testCases).failed = local_308._0_8_;
        (__return_storage_ptr__->testCases).failedButOk = local_308._8_8_;
        std::
        _Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
        ::_M_insert_unique<Catch::TestCase_const&>
                  ((_Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
                    *)&this->m_testsAlreadyRun,(TestCase *)__k._M_p);
      }
      __k._M_p = __k._M_p + 0x118;
    } while (__k._M_p != (pointer)sVar1);
  }
  local_378._0_8_ = (IConfig *)(local_378 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"");
  RunContext::testGroupEnded(&local_298,(string *)local_378,__return_storage_ptr__,1,1);
  if ((IConfig *)local_378._0_8_ != (IConfig *)(local_378 + 0x10)) {
    operator_delete((void *)local_378._0_8_);
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&local_398);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_3b8);
  RunContext::~RunContext(&local_298);
  return __return_storage_ptr__;
}

Assistant:

Totals runTests() {

            RunContext context( m_config.get(), m_reporter );

            Totals totals;

            context.testGroupStarting( "", 1, 1 ); // deprecated?

            TestSpec testSpec = m_config->testSpec();
            if( !testSpec.hasFilters() )
                testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

            std::vector<TestCase> testCases;
            getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, *m_config, testCases );

            int testsRunForGroup = 0;
            for( std::vector<TestCase>::const_iterator it = testCases.begin(), itEnd = testCases.end();
                    it != itEnd;
                    ++it ) {
                testsRunForGroup++;
                if( m_testsAlreadyRun.find( *it ) == m_testsAlreadyRun.end() ) {

                    if( context.aborting() )
                        break;

                    totals += context.runTest( *it );
                    m_testsAlreadyRun.insert( *it );
                }
            }
            context.testGroupEnded( "", totals, 1, 1 );
            return totals;
        }